

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PigLatinTranslator.cpp
# Opt level: O2

string * to_upper_case(string *__return_storage_ptr__,string *str)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = (str->_M_dataplus)._M_p;
  pcVar2 = pcVar1;
  for (; pcVar1 != pcVar2 + str->_M_string_length; pcVar1 = pcVar1 + 1) {
    if (0x19 < (byte)(*pcVar1 + 0xbfU)) {
      *pcVar1 = *pcVar1 + -0x20;
      pcVar2 = (str->_M_dataplus)._M_p;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  return __return_storage_ptr__;
}

Assistant:

std::string to_upper_case(std::string str) {
  for(std::string::iterator letter = str.begin(); letter != str.end(); letter++) {
    if(!is_upper_case(*letter)) {
      *letter = to_upper_case(*letter);
    }
  }
  return str;
}